

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  _Bool _Var1;
  int local_50;
  int local_4c;
  uchar local_48 [4];
  int ret;
  uchar txid [32];
  wally_psbt *src_local;
  wally_psbt *psbt_local;
  
  if ((((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) || (src == (wally_psbt *)0x0))
     || (src->tx == (wally_tx *)0x0)) {
    psbt_local._4_4_ = -2;
  }
  else {
    local_4c = wally_tx_get_txid(src->tx,local_48,0x20);
    if (local_4c == 0) {
      _Var1 = is_matching_txid(psbt->tx,local_48,0x20);
      if (!_Var1) {
        local_4c = -2;
      }
    }
    wally_clear(local_48,0x20);
    if (local_4c == 0) {
      local_50 = psbt_combine(psbt,src);
    }
    else {
      local_50 = local_4c;
    }
    psbt_local._4_4_ = local_50;
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    unsigned char txid[WALLY_TXHASH_LEN];
    int ret;

    if (!psbt || !psbt->tx || !src || !src->tx)
        return WALLY_EINVAL;

    ret = wally_tx_get_txid(src->tx, txid, sizeof(txid));

    if (ret == WALLY_OK && !is_matching_txid(psbt->tx, txid, sizeof(txid)))
        ret = WALLY_EINVAL; /* Transactions don't match */

    wally_clear(txid, sizeof(txid));
    return ret == WALLY_OK ? psbt_combine(psbt, src) : ret;
}